

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void MapOptHandler_specialaction(FMapInfoParser *parse,level_info_t *info)

{
  FSpecialAction *pFVar1;
  uint uVar2;
  int iVar3;
  bool local_39;
  int local_30;
  FName local_2c;
  int j;
  int local_24;
  int max_arg;
  int min_arg;
  FSpecialAction *sa;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  sa = (FSpecialAction *)info;
  info_local = (level_info_t *)parse;
  FMapInfoParser::ParseAssign(parse);
  pFVar1 = sa + 0xd;
  uVar2 = TArray<FSpecialAction,_FSpecialAction>::Reserve
                    ((TArray<FSpecialAction,_FSpecialAction> *)&sa[0xd].Action,1);
  _max_arg = TArray<FSpecialAction,_FSpecialAction>::operator[]
                       ((TArray<FSpecialAction,_FSpecialAction> *)&pFVar1->Action,(ulong)uVar2);
  if (*(int *)&(info_local->RedirectMapName).Chars == 1) {
    FScanner::SetCMode((FScanner *)info_local,true);
  }
  FScanner::MustGetString((FScanner *)info_local);
  FName::FName(&local_2c,*(char **)info_local);
  FName::operator=(&_max_arg->Type,&local_2c);
  FScanner::CheckString((FScanner *)info_local,",");
  FScanner::MustGetString((FScanner *)info_local);
  iVar3 = P_FindLineSpecial(*(char **)info_local,&local_24,&j);
  _max_arg->Action = (BYTE)iVar3;
  if ((_max_arg->Action == '\0') || (local_24 < 0)) {
    FScanner::ScriptError
              ((FScanner *)info_local,"Unknown specialaction \'%s\'",*(undefined8 *)info_local);
  }
  local_30 = 0;
  while( true ) {
    local_39 = false;
    if (local_30 < 5) {
      local_39 = FScanner::CheckString((FScanner *)info_local,",");
    }
    if (local_39 == false) break;
    FScanner::MustGetNumber((FScanner *)info_local);
    _max_arg->Args[local_30] = *(int *)&(info_local->NextMap).Chars;
    local_30 = local_30 + 1;
  }
  if (*(int *)&(info_local->RedirectMapName).Chars == 1) {
    FScanner::SetCMode((FScanner *)info_local,false);
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(specialaction, true)
{
	parse.ParseAssign();

	FSpecialAction *sa = &info->specialactions[info->specialactions.Reserve(1)];
	int min_arg, max_arg;
	if (parse.format_type == parse.FMT_Old) parse.sc.SetCMode(true);
	parse.sc.MustGetString();
	sa->Type = FName(parse.sc.String);
	parse.sc.CheckString(",");
	parse.sc.MustGetString();
	sa->Action = P_FindLineSpecial(parse.sc.String, &min_arg, &max_arg);
	if (sa->Action == 0 || min_arg < 0)
	{
		parse.sc.ScriptError("Unknown specialaction '%s'", parse.sc.String);
	}
	int j = 0;
	while (j < 5 && parse.sc.CheckString(","))
	{
		parse.sc.MustGetNumber();
		sa->Args[j++] = parse.sc.Number;
	}
	if (parse.format_type == parse.FMT_Old) parse.sc.SetCMode(false);
}